

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::SetNextPlotTicksX
               (double x_min,double x_max,int n_ticks,char **labels,bool show_default)

{
  if (n_ticks < 2) {
    __assert_fail("(n_ticks > 1) && \"The number of ticks must be greater than 1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa2f,
                  "void ImPlot::SetNextPlotTicksX(double, double, int, const char *const *, bool)");
  }
  if (SetNextPlotTicksX(double,double,int,char_const**,bool)::buffer == '\0') {
    SetNextPlotTicksX();
  }
  FillRange<double>(&SetNextPlotTicksX::buffer,n_ticks,x_min,x_max);
  if (0 < SetNextPlotTicksX::buffer.Size) {
    SetNextPlotTicksX(SetNextPlotTicksX::buffer.Data,n_ticks,labels,show_default);
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,"T &ImVector<double>::operator[](int) [T = double]");
}

Assistant:

void SetNextPlotTicksX(double x_min, double x_max, int n_ticks, const char* const labels[], bool show_default) {
    IM_ASSERT_USER_ERROR(n_ticks > 1, "The number of ticks must be greater than 1");
    static ImVector<double> buffer;
    FillRange(buffer, n_ticks, x_min, x_max);
    SetNextPlotTicksX(&buffer[0], n_ticks, labels, show_default);
}